

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# store.c
# Opt level: O2

object * store_carry(store *store,object *obj)

{
  bitflag *flags;
  object_kind *poVar1;
  object *obj_00;
  object *obj1;
  _Bool _Var2;
  uint16_t uVar3;
  wchar_t wVar4;
  int iVar5;
  uint uVar6;
  object **ppoVar7;
  wchar_t charges;
  int iVar8;
  
  poVar1 = obj->kind;
  obj_00 = obj->known;
  _Var2 = object_is_carried(player,obj);
  if (_Var2) {
    wVar4 = object_value(obj,L'\x01');
  }
  else {
    wVar4 = object_value_real(obj,L'\x01');
  }
  if (wVar4 == L'\0') {
    return (object *)0x0;
  }
  if ((store->sidx == store_merchant_idx) && (_Var2 = store_can_carry(store,obj->kind), !_Var2)) {
    return (object *)0x0;
  }
  obj->note = 0;
  obj_00->note = 0;
  _Var2 = tval_is_light(obj);
  if (_Var2) {
    flags = obj->flags;
    _Var2 = flag_has_dbg(flags,6,0x19,"obj->flags","OF_NO_FUEL");
    if (!_Var2) {
      _Var2 = flag_has_dbg(flags,6,0x17,"obj->flags","OF_BURNS_OUT");
      if (_Var2) {
        uVar3 = z_info->fuel_torch;
      }
      else {
        _Var2 = flag_has_dbg(flags,6,0x18,"obj->flags","OF_TAKES_FUEL");
        if (!_Var2) goto LAB_001c25d6;
        uVar3 = z_info->default_lamp;
      }
      obj->timeout = uVar3;
    }
  }
  else {
    _Var2 = tval_can_have_timeout(obj);
    if (_Var2) {
      obj->timeout = 0;
    }
    else {
      _Var2 = tval_is_launcher(obj);
      if (_Var2) {
        obj->known->pval = obj->pval;
      }
      else {
        _Var2 = tval_can_have_charges(obj);
        if ((_Var2) && (_Var2 = store_can_carry(store,obj->kind), _Var2)) {
          iVar8 = 0;
          for (uVar6 = 0; uVar6 < obj->number; uVar6 = uVar6 + 1) {
            iVar5 = randcalc((random_value)poVar1->charge,0,RANDOMISE);
            iVar8 = iVar8 + iVar5;
          }
          if (obj->pval < iVar8) {
            obj->pval = (int16_t)iVar8;
          }
        }
      }
    }
  }
LAB_001c25d6:
  ppoVar7 = &store->stock;
  while (obj1 = *ppoVar7, obj1 != (object *)0x0) {
    _Var2 = object_mergeable(obj1,obj,OSTACK_STORE);
    if (_Var2) {
      store_object_absorb(obj1->known,obj_00);
      obj->known = (object *)0x0;
      store_object_absorb(obj1,obj);
      return obj1;
    }
    ppoVar7 = &obj1->next;
  }
  if (store->stock_size <= (short)(ushort)store->stock_num) {
    return (object *)0x0;
  }
  pile_insert(&store->stock,obj);
  pile_insert(&store->stock_k,obj_00);
  store->stock_num = store->stock_num + '\x01';
  return obj;
}

Assistant:

struct object *store_carry(struct store *store, struct object *obj)
{
	unsigned int i;
	uint32_t value;
	struct object *temp_obj, *known_obj = obj->known;

	struct object_kind *kind = obj->kind;

	/* Evaluate the object */
	if (object_is_carried(player, obj))
		value = object_value(obj, 1);
	else
		value = object_value_real(obj, 1);

	/* Cursed/Worthless items "disappear" when sold */
	if (value <= 0)
		return NULL;

	/* The merchant puts everything not displayed in his travelling bag */
	if (store_is_merchant(store) && !store_can_carry(store, obj->kind)) {
		return NULL;
	}

	/* Erase the inscription */
	obj->note = 0;
	known_obj->note = 0;

	/* Some item types require maintenance */
	if (tval_is_light(obj)) {
		if (!of_has(obj->flags, OF_NO_FUEL)) {
			if (of_has(obj->flags, OF_BURNS_OUT))
				obj->timeout = z_info->fuel_torch;

			else if (of_has(obj->flags, OF_TAKES_FUEL))
				obj->timeout = z_info->default_lamp;
		}
	} else if (tval_can_have_timeout(obj)) {
		obj->timeout = 0;
	} else if (tval_is_launcher(obj)) {
		obj->known->pval = obj->pval;
	} else if (tval_can_have_charges(obj)) {
		/* If the store can stock this item kind, we recharge */
		if (store_can_carry(store, obj->kind)) {
			int charges = 0;

			/* Calculate the recharged number of charges */
			for (i = 0; i < obj->number; i++)
				charges += randcalc(kind->charge, 0, RANDOMISE);

			/* Use recharged value only if greater */
			if (charges > obj->pval)
				obj->pval = charges;
		}
	}

	for (temp_obj = store->stock; temp_obj; temp_obj = temp_obj->next) {
		/* Can the existing items be incremented? */
		if (object_mergeable(temp_obj, obj, OSTACK_STORE)) {
			/* Absorb (some of) the object */
			store_object_absorb(temp_obj->known, known_obj);
			obj->known = NULL;
			store_object_absorb(temp_obj, obj);

			/* All done */
			return temp_obj;
		}
	}

	/* No space? */
	if (store->stock_num >= store->stock_size)
		return NULL;

	/* Insert the new object */
	pile_insert(&store->stock, obj);
	pile_insert(&store->stock_k, known_obj);
	store->stock_num++;

	return obj;
}